

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O1

void __thiscall
btDiscreteDynamicsWorld::removeConstraint
          (btDiscreteDynamicsWorld *this,btTypedConstraint *constraint)

{
  btTypedConstraint *local_10;
  
  local_10 = constraint;
  btAlignedObjectArray<btTypedConstraint_*>::remove(&this->m_constraints,(char *)&local_10);
  btRigidBody::removeConstraintRef(local_10->m_rbA,local_10);
  btRigidBody::removeConstraintRef(local_10->m_rbB,local_10);
  return;
}

Assistant:

void	btDiscreteDynamicsWorld::removeConstraint(btTypedConstraint* constraint)
{
	m_constraints.remove(constraint);
	constraint->getRigidBodyA().removeConstraintRef(constraint);
	constraint->getRigidBodyB().removeConstraintRef(constraint);
}